

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void terminal_bind_arrow(EditLine *el)

{
  byte *pbVar1;
  uint uVar2;
  bool bVar3;
  el_action_t *local_78;
  el_action_t *local_70;
  ulong local_68;
  size_t n;
  wchar_t *px;
  wchar_t wt_str [8];
  funckey_t *arrow;
  char *p;
  wchar_t j;
  wchar_t i;
  el_action_t *dmap;
  el_action_t *map;
  EditLine *el_local;
  
  wt_str._24_8_ = (el->el_terminal).t_fkey;
  if (((el->el_terminal).t_buf != (char *)0x0) && ((el->el_map).key != (el_action_t *)0x0)) {
    if ((el->el_map).type == L'\x01') {
      local_70 = (el->el_map).alt;
    }
    else {
      local_70 = (el->el_map).key;
    }
    if ((el->el_map).type == L'\x01') {
      local_78 = (el->el_map).vic;
    }
    else {
      local_78 = (el->el_map).emacs;
    }
    terminal_reset_arrow(el);
    for (p._4_4_ = 0; p._4_4_ < 7; p._4_4_ = p._4_4_ + 1) {
      pbVar1 = (byte *)(el->el_terminal).t_str[*(int *)(wt_str._24_8_ + (long)p._4_4_ * 0x20 + 8)];
      if ((pbVar1 != (byte *)0x0) && (*pbVar1 != 0)) {
        local_68 = 0;
        while( true ) {
          bVar3 = false;
          if (local_68 < 8) {
            bVar3 = pbVar1[local_68] != 0;
          }
          if (!bVar3) break;
          wt_str[local_68 - 2] = (int)(char)pbVar1[local_68];
          local_68 = local_68 + 1;
        }
        while (local_68 < 8) {
          wt_str[local_68 - 2] = L'\0';
          local_68 = local_68 + 1;
        }
        uVar2 = (uint)*pbVar1;
        if (*(int *)(wt_str._24_8_ + (long)p._4_4_ * 0x20 + 0x18) == 2) {
          keymacro_clear(el,local_70,(wchar_t *)&px);
        }
        else if ((pbVar1[1] == 0) ||
                ((local_78[(int)uVar2] != local_70[(int)uVar2] && (local_70[(int)uVar2] != '\x19')))
                ) {
          if (local_70[(int)uVar2] == '\x1c') {
            keymacro_clear(el,local_70,(wchar_t *)&px);
            if (*(int *)(wt_str._24_8_ + (long)p._4_4_ * 0x20 + 0x18) == 0) {
              local_70[(int)uVar2] = *(el_action_t *)(wt_str._24_8_ + (long)p._4_4_ * 0x20 + 0x10);
            }
            else {
              keymacro_add(el,(wchar_t *)&px,
                           (keymacro_value_t *)(wt_str._24_8_ + (long)p._4_4_ * 0x20 + 0x10),
                           *(wchar_t *)(wt_str._24_8_ + (long)p._4_4_ * 0x20 + 0x18));
            }
          }
        }
        else {
          keymacro_add(el,(wchar_t *)&px,
                       (keymacro_value_t *)(wt_str._24_8_ + (long)p._4_4_ * 0x20 + 0x10),
                       *(wchar_t *)(wt_str._24_8_ + (long)p._4_4_ * 0x20 + 0x18));
          local_70[(int)uVar2] = '\x19';
        }
      }
    }
  }
  return;
}

Assistant:

libedit_private void
terminal_bind_arrow(EditLine *el)
{
	el_action_t *map;
	const el_action_t *dmap;
	int i, j;
	char *p;
	funckey_t *arrow = el->el_terminal.t_fkey;

	/* Check if the components needed are initialized */
	if (el->el_terminal.t_buf == NULL || el->el_map.key == NULL)
		return;

	map = el->el_map.type == MAP_VI ? el->el_map.alt : el->el_map.key;
	dmap = el->el_map.type == MAP_VI ? el->el_map.vic : el->el_map.emacs;

	terminal_reset_arrow(el);

	for (i = 0; i < A_K_NKEYS; i++) {
		wchar_t wt_str[VISUAL_WIDTH_MAX];
		wchar_t *px;
		size_t n;

		p = el->el_terminal.t_str[arrow[i].key];
		if (!p || !*p)
			continue;
		for (n = 0; n < VISUAL_WIDTH_MAX && p[n]; ++n)
			wt_str[n] = p[n];
		while (n < VISUAL_WIDTH_MAX)
			wt_str[n++] = '\0';
		px = wt_str;
		j = (unsigned char) *p;
		/*
		 * Assign the arrow keys only if:
		 *
		 * 1. They are multi-character arrow keys and the user
		 *    has not re-assigned the leading character, or
		 *    has re-assigned the leading character to be
		 *	  ED_SEQUENCE_LEAD_IN
		 * 2. They are single arrow keys pointing to an
		 *    unassigned key.
		 */
		if (arrow[i].type == XK_NOD)
			keymacro_clear(el, map, px);
		else {
			if (p[1] && (dmap[j] == map[j] ||
				map[j] == ED_SEQUENCE_LEAD_IN)) {
				keymacro_add(el, px, &arrow[i].fun,
				    arrow[i].type);
				map[j] = ED_SEQUENCE_LEAD_IN;
			} else if (map[j] == ED_UNASSIGNED) {
				keymacro_clear(el, map, px);
				if (arrow[i].type == XK_CMD)
					map[j] = arrow[i].fun.cmd;
				else
					keymacro_add(el, px, &arrow[i].fun,
					    arrow[i].type);
			}
		}
	}
}